

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O2

void indexesFromRange<QList<QModelIndex>>(QItemSelectionRange *range,QList<QModelIndex> *result)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  QAbstractItemModel *pQVar5;
  int acolumn;
  int arow;
  long in_FS_OFFSET;
  undefined1 *local_98;
  undefined1 *puStack_90;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_88;
  undefined1 *local_78;
  undefined1 *puStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  undefined8 local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QItemSelectionRange::isValid(range);
  if (bVar1) {
    pQVar5 = QPersistentModelIndex::model(&range->tl);
    if (pQVar5 != (QAbstractItemModel *)0x0) {
      local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      QPersistentModelIndex::operator_cast_to_QModelIndex(&range->tl);
      iVar2 = QPersistentModelIndex::row(&range->br);
      iVar3 = QPersistentModelIndex::column(&range->br);
      for (arow = (int)local_58; arow <= iVar2; arow = arow + 1) {
        local_68.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_78 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
        QModelIndex::sibling((QModelIndex *)&local_78,(QModelIndex *)&local_58,arow,local_58._4_4_);
        for (acolumn = local_58._4_4_; acolumn <= iVar3; acolumn = acolumn + 1) {
          local_88.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
          local_98 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
          QModelIndex::sibling((QModelIndex *)&local_98,(QModelIndex *)&local_78,arow,acolumn);
          pQVar5 = QPersistentModelIndex::model(&range->tl);
          uVar4 = (*(pQVar5->super_QObject)._vptr_QObject[0x27])(pQVar5,(QModelIndex *)&local_98);
          if ((~uVar4 & 0x21) == 0) {
            QList<QModelIndex>::emplaceBack<QModelIndex_const&>(result,(QModelIndex *)&local_98);
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void indexesFromRange(const QItemSelectionRange &range, ModelIndexContainer &result)
{
    if (range.isValid() && range.model()) {
        const QModelIndex topLeft = range.topLeft();
        const int bottom = range.bottom();
        const int right = range.right();
        for (int row = topLeft.row(); row <= bottom; ++row) {
            const QModelIndex columnLeader = topLeft.sibling(row, topLeft.column());
            for (int column = topLeft.column(); column <= right; ++column) {
                QModelIndex index = columnLeader.sibling(row, column);
                if (isSelectableAndEnabled(range.model()->flags(index)))
                    result.push_back(index);
            }
        }
    }
}